

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread1(void)

{
  _Bool _Var1;
  char local_58 [8];
  char str [64];
  int local_c;
  int tok;
  
  put_str("[Thread 1] started");
  local_c = 0;
  while (_Var1 = shutting_down(), ((_Var1 ^ 0xffU) & 1) != 0) {
    local_c = local_c + 1;
    snprintf(local_58,0x40,"[Thread 1] running: %d");
    put_str(local_58);
    if (local_c % 0x1e == 0) {
      message = MsgFork;
    }
    else if (local_c % 6 == 0) {
      message = MsgPing;
    }
    yield();
  }
  put_str("[Thread 1] exiting");
  return;
}

Assistant:

static void
thread1(void)
{
    put_str("[Thread 1] started");
    int tok = 0;
    while (!shutting_down()) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 1] running: %d", tok++);
        put_str(str);
        if (tok % 30 == 0)
            message = MsgFork;
        else if (tok % 6 == 0)
            message = MsgPing;
        yield();
    }
    put_str("[Thread 1] exiting");
}